

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O1

ON_Curve * ON_TrimCurve(ON_Curve *curve,ON_Interval trim_parameters)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  ON_Object *p;
  ON_Object *p_00;
  ON_PolyCurve *this;
  ON_PolyCurve *this_00;
  ON_Curve *c;
  undefined4 extraout_var_01;
  _func_int **pp_Var6;
  double dVar7;
  double dVar8;
  double dVar9;
  ON_Interval curve_domain;
  ON_Interval sdom;
  ON_Interval local_68;
  double local_58;
  ON_Interval local_50;
  ON_Interval local_40;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  dVar9 = trim_parameters.m_t[1];
  local_68.m_t[0] = trim_parameters.m_t[0];
  local_68.m_t[1] = dVar9;
  (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  local_50.m_t[1] = dVar9;
  bVar1 = ON_Interval::IsDecreasing(&local_68);
  ON_Interval::Intersection(&local_68,&local_50);
  if (bVar1) {
    ON_Interval::Swap(&local_68);
    pdVar5 = ON_Interval::operator[](&local_68,0);
    dVar9 = *pdVar5;
    iVar2 = 1;
    dVar7 = ON_Interval::operator[](&local_50,1);
    pdVar5 = ON_Interval::operator[](&local_68,1);
    local_58 = *pdVar5;
    dVar8 = ON_Interval::operator[](&local_50,0);
    if ((dVar9 != dVar7) || (NAN(dVar9) || NAN(dVar7))) {
      if ((local_58 != dVar8) || (NAN(local_58) || NAN(dVar8))) {
        bVar1 = ON_Interval::IsDecreasing(&local_68);
        if (!bVar1) {
          return (ON_Curve *)0x0;
        }
        goto LAB_0042c7bd;
      }
    }
    else {
      if ((local_58 == dVar8) && (!NAN(local_58) && !NAN(dVar8))) {
        return (ON_Curve *)0x0;
      }
      iVar2 = 0;
    }
    dVar9 = ON_Interval::operator[](&local_50,iVar2);
    pdVar5 = ON_Interval::operator[](&local_68,iVar2);
    *pdVar5 = dVar9;
  }
LAB_0042c7bd:
  bVar1 = ON_Interval::IsDecreasing(&local_68);
  if ((bVar1) &&
     (iVar2 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(curve),
     (char)iVar2 != '\0')) {
    iVar2 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(curve);
    p = (ON_Object *)CONCAT44(extraout_var,iVar2);
    pdVar5 = ON_Interval::operator[](&local_68,0);
    dVar9 = *pdVar5;
    dVar7 = ON_Interval::operator[](&local_50,1);
    ON_Interval::ON_Interval(&local_40,dVar9,dVar7);
    iVar2 = (*p->_vptr_ON_Object[0x3c])(p);
    if ((char)iVar2 == '\0') {
      pp_Var6 = p->_vptr_ON_Object;
      goto LAB_0042c9e8;
    }
    iVar2 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(curve);
    p_00 = (ON_Object *)CONCAT44(extraout_var_00,iVar2);
    dVar9 = ON_Interval::operator[](&local_50,0);
    pdVar5 = ON_Interval::operator[](&local_68,1);
    ON_Interval::ON_Interval(&local_40,dVar9,*pdVar5);
    iVar2 = (*p_00->_vptr_ON_Object[0x3c])(p_00);
    if ((char)iVar2 != '\0') {
      this = ON_PolyCurve::Cast(p);
      if (this == (ON_PolyCurve *)0x0) {
        this = (ON_PolyCurve *)operator_new(0x40);
        ON_PolyCurve::ON_PolyCurve(this);
        ON_PolyCurve::Append(this,(ON_Curve *)p);
      }
      this_00 = ON_PolyCurve::Cast(p_00);
      if (this_00 == (ON_PolyCurve *)0x0) {
        ON_PolyCurve::Append(this,(ON_Curve *)p_00);
      }
      else {
        iVar3 = ON_PolyCurve::Count(this_00);
        if (0 < iVar3) {
          iVar3 = 0;
          do {
            local_40 = ON_PolyCurve::SegmentDomain(this_00,iVar3);
            c = ON_PolyCurve::HarvestSegment(this_00,iVar3);
            pdVar5 = ON_Interval::operator[](&local_40,0);
            dVar9 = *pdVar5;
            pdVar5 = ON_Interval::operator[](&local_40,1);
            (*(c->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(dVar9,*pdVar5,c);
            ON_PolyCurve::Append(this,c);
            iVar3 = iVar3 + 1;
            iVar4 = ON_PolyCurve::Count(this_00);
          } while (iVar3 < iVar4);
        }
        (*p_00->_vptr_ON_Object[4])(p_00);
      }
      pdVar5 = ON_Interval::operator[](&local_68,0);
      dVar9 = *pdVar5;
      pdVar5 = ON_Interval::operator[](&local_68,1);
      dVar7 = *pdVar5;
      dVar8 = ON_Interval::Length(&local_50);
      (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (dVar9,dVar7 + dVar8,this);
      if ((char)iVar2 != '\0') {
        return &this->super_ON_Curve;
      }
      return (ON_Curve *)0x0;
    }
    (*p->_vptr_ON_Object[4])(p);
    p = p_00;
  }
  else {
    bVar1 = ON_Interval::IsIncreasing(&local_68);
    if (!bVar1) {
      return (ON_Curve *)0x0;
    }
    iVar2 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(curve);
    p = (ON_Object *)CONCAT44(extraout_var_01,iVar2);
    if (p == (ON_Object *)0x0) {
      return (ON_Curve *)0x0;
    }
    iVar2 = (*p->_vptr_ON_Object[0x3c])(p,&local_68);
    if ((char)iVar2 != '\0') {
      return (ON_Curve *)p;
    }
  }
  pp_Var6 = p->_vptr_ON_Object;
LAB_0042c9e8:
  (*pp_Var6[4])(p);
  return (ON_Curve *)0x0;
}

Assistant:

ON_Curve* ON_TrimCurve( 
            const ON_Curve& curve,
            ON_Interval trim_parameters
            )
{
  ON_Curve* trimmed_curve = 0;

  const ON_Interval curve_domain = curve.Domain();
  bool bDecreasing = trim_parameters.IsDecreasing();
  trim_parameters.Intersection( curve_domain ); // trim_parameters will be increasing or empty
  if ( bDecreasing )
  {
    trim_parameters.Swap();
    if ( trim_parameters[0] == curve_domain[1] )
    {
      if ( trim_parameters[1] == curve_domain[0] )
        return 0;
      trim_parameters[0] = curve_domain[0];
    }
    else if ( trim_parameters[1] == curve_domain[0] )
      trim_parameters[1] = curve_domain[1];
    else if ( !trim_parameters.IsDecreasing() )
      return 0;
  }

  if ( trim_parameters.IsDecreasing() && curve.IsClosed() )
  {
    ON_Curve* left_crv = curve.DuplicateCurve();
    if ( !left_crv->Trim(ON_Interval(trim_parameters[0],curve_domain[1])) )
    {
      delete left_crv;
      return 0;
    }
    ON_Curve* right_crv = curve.DuplicateCurve();
    if ( !right_crv->Trim(ON_Interval(curve_domain[0],trim_parameters[1])) )
    {
      delete left_crv;
      delete right_crv;
      return 0;
    }
    ON_PolyCurve* polycurve = ON_PolyCurve::Cast(left_crv);
    if ( polycurve == nullptr )
    {
      polycurve = new ON_PolyCurve();      
      polycurve->Append( left_crv );
    }

    ON_PolyCurve* ptmp = ON_PolyCurve::Cast(right_crv);
    if ( ptmp )
    {
      int i;
      for ( i = 0; i < ptmp->Count(); i++ )
      {
        ON_Interval sdom = ptmp->SegmentDomain(i);
        ON_Curve* segment = ptmp->HarvestSegment(i);
        segment->SetDomain(sdom[0],sdom[1]); // to keep relative parameterization unchanged
        polycurve->Append( segment );
      }
      delete right_crv;
      ptmp = 0;
      right_crv = 0;
    }
    else
    {
      polycurve->Append( right_crv );
    }

    polycurve->SetDomain( trim_parameters[0], trim_parameters[1] + curve_domain.Length() );

    trimmed_curve = polycurve;
  }
  else if ( trim_parameters.IsIncreasing() )
  {
    trimmed_curve = curve.DuplicateCurve();
    if(!trimmed_curve || !trimmed_curve->Trim(trim_parameters) )
    {
      delete trimmed_curve;
      trimmed_curve = 0;
    }
  }

  return trimmed_curve;
}